

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

string * __thiscall
OutputFile::generateRecursive(string *__return_storage_ptr__,OutputFile *this,string *prefix)

{
  OutputFile *this_00;
  bool bVar1;
  reference ppOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  _Self local_c8;
  _Self local_c0;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *prefix_local;
  OutputFile *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = prefix;
  prefix_local = (string *)this;
  this_local = (OutputFile *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,prefix,
                 &this->key);
  std::operator+(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "=");
  std::operator+(&local_78,&local_98,&this->value);
  std::operator+(&local_58,&local_78,&this->eol);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&it);
  local_c0._M_node =
       (_List_node_base *)
       std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::begin(&this->descendants);
  while( true ) {
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::end(&this->descendants);
    bVar1 = std::operator!=(&local_c0,&local_c8);
    if (!bVar1) break;
    ppOVar2 = std::_List_iterator<OutputFile_*>::operator*(&local_c0);
    this_00 = *ppOVar2;
    std::operator+(&local_128,prefix,&this->key);
    std::operator+(&local_108,&local_128,&this->keySeparator);
    generateRecursive(&local_e8,this_00,&local_108);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::_List_iterator<OutputFile_*>::operator++(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

string
OutputFile::generateRecursive(string prefix) {
  string result = "";

  result += prefix + key + "=" + value + eol;

  for (list<OutputFile*>::iterator it = descendants.begin(); it != descendants.end(); ++it) {
    result += (*it)->generateRecursive(prefix + key + keySeparator);
  }

  return result;
}